

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void libtorrent::aux::utp_stream::on_read
               (utp_stream *s,size_t bytes_transferred,error_code *ec,bool shutdown)

{
  io_context *ctx;
  type local_60;
  byte local_21;
  error_code *peStack_20;
  bool shutdown_local;
  error_code *ec_local;
  size_t bytes_transferred_local;
  utp_stream *s_local;
  
  ctx = s->m_io_service;
  local_21 = shutdown;
  peStack_20 = ec;
  ec_local = (error_code *)bytes_transferred;
  bytes_transferred_local = (size_t)s;
  ::std::
  bind<void,std::function<void(boost::system::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long_const&>
            (&local_60,&s->m_read_handler,ec,(unsigned_long *)&ec_local);
  boost::asio::
  post<boost::asio::io_context,std::_Bind_result<void,std::function<void(boost::system::error_code_const&,unsigned_long)>(boost::system::error_code,unsigned_long)>>
            (ctx,&local_60,(type *)0x0);
  ::std::
  _Bind_result<void,_std::function<void_(const_boost::system::error_code_&,_unsigned_long)>_(boost::system::error_code,_unsigned_long)>
  ::~_Bind_result(&local_60);
  ::std::function<void_(const_boost::system::error_code_&,_unsigned_long)>::operator=
            ((function<void_(const_boost::system::error_code_&,_unsigned_long)> *)
             (bytes_transferred_local + 0x20),(nullptr_t)0x0);
  if (((local_21 & 1) != 0) && (*(long *)(bytes_transferred_local + 0x88) != 0)) {
    utp_socket_impl::detach(*(utp_socket_impl **)(bytes_transferred_local + 0x88));
    *(undefined8 *)(bytes_transferred_local + 0x88) = 0;
  }
  return;
}

Assistant:

void utp_stream::on_read(utp_stream* s, std::size_t const bytes_transferred
	, error_code const& ec, bool const shutdown)
{
	UTP_LOGV("%8p: calling read handler read:%d ec:%s shutdown:%d\n", static_cast<void*>(s->m_impl)
		, int(bytes_transferred), ec.message().c_str(), shutdown);

	TORRENT_ASSERT(s->m_read_handler);
	TORRENT_ASSERT(bytes_transferred > 0 || ec || s->m_impl->null_buffers());
	post(s->m_io_service, std::bind<void>(std::move(s->m_read_handler), ec, bytes_transferred));
	s->m_read_handler = nullptr;
	if (shutdown && s->m_impl)
	{
		TORRENT_ASSERT(ec);
		s->m_impl->detach();
		s->m_impl = nullptr;
	}
}